

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_123::PromisedAsyncOutputStream::write
          (PromisedAsyncOutputStream *this,int __fd,void *__buf,size_t __n)

{
  AsyncOutputStream *pAVar1;
  undefined4 in_register_00000034;
  Type local_50;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *local_38;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *s;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *_s2518;
  PromisedAsyncOutputStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  _s2518 = (Own<kj::AsyncOutputStream,_std::nullptr_t> *)CONCAT44(in_register_00000034,__fd);
  this_local = (PromisedAsyncOutputStream *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  local_38 = kj::_::readMaybe<kj::AsyncOutputStream,decltype(nullptr)>
                       ((Maybe<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> *)&_s2518[1].ptr);
  s = local_38;
  if (local_38 == (Own<kj::AsyncOutputStream,_std::nullptr_t> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_50);
    Promise<void>::
    then<kj::(anonymous_namespace)::PromisedAsyncOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>
              ((Promise<void> *)this,&local_50);
    Promise<void>::~Promise((Promise<void> *)&local_50);
  }
  else {
    pAVar1 = Own<kj::AsyncOutputStream,_std::nullptr_t>::operator->(local_38);
    local_50.pieces.ptr = (ArrayPtr<const_unsigned_char> *)this_local;
    local_50.pieces.size_ = (size_t)pieces_local.ptr;
    (*pAVar1->_vptr_AsyncOutputStream[1])(this,pAVar1,this_local,pieces_local.ptr);
  }
  return (ssize_t)this;
}

Assistant:

KJ_IF_SOME(s, stream) {
      return s->write(pieces);
    }